

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyformat.h
# Opt level: O0

string * tinyformat::
         format<long,int,int,int,std::__cxx11::string,double,double,double,double,double,double,double,double,double,double,double,double,double,double,double>
                   (char *fmt,long *args,int *args_1,int *args_2,int *args_3,
                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_4,
                   double *args_5,double *args_6,double *args_7,double *args_8,double *args_9,
                   double *args_10,double *args_11,double *args_12,double *args_13,double *args_14,
                   double *args_15,double *args_16,double *args_17,double *args_18,double *args_19)

{
  long *in_RCX;
  string *in_RDI;
  long in_FS_OFFSET;
  int *in_stack_00000048;
  int *in_stack_00000050;
  int *in_stack_00000058;
  double *in_stack_00000060;
  double *in_stack_00000068;
  double *in_stack_00000070;
  double *in_stack_00000078;
  double *in_stack_00000080;
  double *in_stack_00000088;
  double *in_stack_00000090;
  double *in_stack_00000098;
  double *in_stack_000000a0;
  double *in_stack_000000a8;
  double *in_stack_000000b0;
  double *in_stack_000000b8;
  double *in_stack_000000c0;
  double *in_stack_000000c8;
  ostringstream oss;
  undefined1 local_2d8 [144];
  string *local_248;
  ostringstream *local_240;
  undefined1 *local_238;
  char *in_stack_fffffffffffffe10;
  ostream *in_stack_fffffffffffffe18;
  ostringstream local_1b0 [376];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_240 = local_1b0;
  local_248 = in_RDI;
  std::__cxx11::ostringstream::ostringstream(local_240);
  local_238 = local_2d8;
  format<long,int,int,int,std::__cxx11::string,double,double,double,double,double,double,double,double,double,double,double,double,double,double,double>
            (in_stack_fffffffffffffe18,in_stack_fffffffffffffe10,in_RCX,in_stack_00000048,
             in_stack_00000050,in_stack_00000058,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_stack_00000050,
             (double *)in_stack_00000058,in_stack_00000060,in_stack_00000068,in_stack_00000070,
             in_stack_00000078,in_stack_00000080,in_stack_00000088,in_stack_00000090,
             in_stack_00000098,in_stack_000000a0,in_stack_000000a8,in_stack_000000b0,
             in_stack_000000b8,in_stack_000000c0,in_stack_000000c8);
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream(local_1b0);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return local_248;
  }
  __stack_chk_fail();
}

Assistant:

std::string format(const char* fmt, const Args&... args)
{
    std::ostringstream oss;
    format(oss, fmt, args...);
    return oss.str();
}